

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O0

void zt_gc_protect(zt_gc_t *gc,void *value)

{
  zt_elist_t *in_RSI;
  long in_RDI;
  zt_gc_collectable_t *mark;
  zt_elist_t *head;
  
  head = in_RSI;
  (**(code **)(in_RDI + 0x18))(in_RSI);
  zt_elist_remove((zt_elist_t *)0x108a7f);
  zt_elist_add(head,in_RSI);
  *(uint *)&in_RSI[1].prev = *(uint *)&in_RSI[1].prev | 2;
  return;
}

Assistant:

void
zt_gc_protect(zt_gc_t *gc, void *value)
{
    zt_gc_collectable_t * mark;

    mark = (zt_gc_collectable_t    *)value;

    gc->clear_white(mark);
    zt_elist_remove(&mark->list);
    zt_elist_add(gc->grey, &mark->list);
    ZT_BIT_SET(mark->colour, protected);
}